

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiWindowSettings * ImGui::CreateNewWindowSettings(char *name)

{
  ImGuiID IVar1;
  char *pcVar2;
  size_t data_size;
  ImGuiWindowSettings *pIVar3;
  ImChunkStream<ImGuiWindowSettings> *this;
  
  this = &GImGui->SettingsWindows;
  pcVar2 = strstr(name,"###");
  if (pcVar2 != (char *)0x0) {
    name = pcVar2;
  }
  data_size = strlen(name);
  pIVar3 = ImChunkStream<ImGuiWindowSettings>::alloc_chunk(this,data_size + 0x21);
  pIVar3->ViewportId = 0;
  pIVar3->DockId = 0;
  pIVar3->ClassId = 0;
  pIVar3->DockOrder = 0;
  pIVar3->Collapsed = false;
  pIVar3->WantApply = false;
  pIVar3->ID = 0;
  (pIVar3->Pos).x = 0;
  (pIVar3->Pos).y = 0;
  (pIVar3->Size).x = 0;
  (pIVar3->Size).y = 0;
  (pIVar3->ViewportPos).x = 0;
  (pIVar3->ViewportPos).y = 0;
  pIVar3->DockOrder = -1;
  IVar1 = ImHashStr(name,data_size,0);
  pIVar3->ID = IVar1;
  memcpy(pIVar3 + 1,name,data_size + 1);
  return pIVar3;
}

Assistant:

ImGuiWindowSettings* ImGui::CreateNewWindowSettings(const char* name)
{
    ImGuiContext& g = *GImGui;

#if !IMGUI_DEBUG_INI_SETTINGS
    // Skip to the "###" marker if any. We don't skip past to match the behavior of GetID()
    // Preserve the full string when IMGUI_DEBUG_INI_SETTINGS is set to make .ini inspection easier.
    if (const char* p = strstr(name, "###"))
        name = p;
#endif
    const size_t name_len = strlen(name);

    // Allocate chunk
    const size_t chunk_size = sizeof(ImGuiWindowSettings) + name_len + 1;
    ImGuiWindowSettings* settings = g.SettingsWindows.alloc_chunk(chunk_size);
    IM_PLACEMENT_NEW(settings) ImGuiWindowSettings();
    settings->ID = ImHashStr(name, name_len);
    memcpy(settings->GetName(), name, name_len + 1);   // Store with zero terminator

    return settings;
}